

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::js::GeneratorOptions::ParseFromOptions
          (GeneratorOptions *this,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *options,string *error)

{
  int iVar1;
  LogMessage *other;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  char *pcVar5;
  bool bVar6;
  ulong uVar7;
  char *pcVar8;
  pointer ppVar9;
  GeneratorOptions *pGVar10;
  long lVar11;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  GeneratorOptions *local_a8;
  GeneratorOptions *local_a0;
  GeneratorOptions *local_98;
  GeneratorOptions *local_90;
  undefined1 local_88 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppVar9 = (options->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((options->
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppVar9) {
    local_a8 = (GeneratorOptions *)&this->extension;
    local_a0 = (GeneratorOptions *)&this->library;
    local_98 = (GeneratorOptions *)&this->namespace_prefix;
    lVar11 = 0;
    uVar7 = 0;
    local_90 = this;
    do {
      iVar1 = std::__cxx11::string::compare
                        ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11));
      ppVar9 = (options->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (iVar1 == 0) {
        iVar1 = std::__cxx11::string::compare
                          ((char *)((long)&(ppVar9->second)._M_dataplus._M_p + lVar11));
        if (iVar1 != 0) {
          pcVar8 = (char *)error->_M_string_length;
          pcVar5 = "Unexpected option value for add_require_for_enums";
          goto LAB_0025a8c2;
        }
        this->add_require_for_enums = true;
      }
      else {
        iVar1 = std::__cxx11::string::compare
                          ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11));
        ppVar9 = (options->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (iVar1 == 0) {
          iVar1 = std::__cxx11::string::compare
                            ((char *)((long)&(ppVar9->second)._M_dataplus._M_p + lVar11));
          if (iVar1 != 0) {
            pcVar8 = (char *)error->_M_string_length;
            pcVar5 = "Unexpected option value for binary";
            goto LAB_0025a8c2;
          }
          this->binary = true;
        }
        else {
          iVar1 = std::__cxx11::string::compare
                            ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11));
          ppVar9 = (options->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (iVar1 == 0) {
            iVar1 = std::__cxx11::string::compare
                              ((char *)((long)&(ppVar9->second)._M_dataplus._M_p + lVar11));
            if (iVar1 != 0) {
              pcVar8 = (char *)error->_M_string_length;
              pcVar5 = "Unexpected option value for testonly";
              goto LAB_0025a8c2;
            }
            this->testonly = true;
          }
          else {
            iVar1 = std::__cxx11::string::compare
                              ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11));
            if (iVar1 == 0) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_88,LOGLEVEL_WARNING,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                         ,0xd8d);
              other = internal::LogMessage::operator<<
                                ((LogMessage *)local_88,
                                 "Ignoring error_on_name_conflict option, this will be removed in a future release"
                                );
              internal::LogFinisher::operator=((LogFinisher *)&local_c8,other);
              internal::LogMessage::~LogMessage((LogMessage *)local_88);
              this = local_90;
            }
            else {
              iVar1 = std::__cxx11::string::compare
                                ((char *)((long)&(((options->
                                                                                                      
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                 )._M_dataplus._M_p + lVar11));
              pGVar10 = this;
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare
                                  ((char *)((long)&(((options->
                                                                                                          
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar11));
                pGVar10 = local_98;
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare
                                    ((char *)((long)&(((options->
                                                                                                              
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar11));
                  pGVar10 = local_a0;
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::string::compare
                                      ((char *)((long)&(((options->
                                                                                                                  
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar11));
                    ppVar9 = (options->
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    if (iVar1 == 0) {
                      iVar1 = std::__cxx11::string::compare
                                        ((char *)((long)&(ppVar9->second)._M_dataplus._M_p + lVar11)
                                        );
                      if (iVar1 == 0) {
                        this->import_style = kImportClosure;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare
                                          ((char *)((long)&(((options->
                                                                                                                          
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar11));
                        if (iVar1 == 0) {
                          this->import_style = kImportCommonJs;
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare
                                            ((char *)((long)&(((options->
                                                                                                                              
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar11));
                          if (iVar1 == 0) {
                            this->import_style = kImportCommonJsStrict;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare
                                              ((char *)((long)&(((options->
                                                                                                                                  
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar11));
                            if (iVar1 == 0) {
                              this->import_style = kImportBrowser;
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare
                                                ((char *)((long)&(((options->
                                                                                                                                      
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar11));
                              if (iVar1 == 0) {
                                this->import_style = kImportEs6;
                              }
                              else {
                                std::operator+(&local_50,"Unknown import style ",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)((long)&(((options->
                                                                                                                        
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar11));
                                plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
                                local_c8 = &local_b8;
                                plVar3 = plVar2 + 2;
                                if ((long *)*plVar2 == plVar3) {
                                  local_b8 = *plVar3;
                                  lStack_b0 = plVar2[3];
                                }
                                else {
                                  local_b8 = *plVar3;
                                  local_c8 = (long *)*plVar2;
                                }
                                local_c0 = plVar2[1];
                                *plVar2 = (long)plVar3;
                                plVar2[1] = 0;
                                *(undefined1 *)(plVar2 + 2) = 0;
                                plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
                                local_88._0_8_ = local_88 + 0x10;
                                psVar4 = (size_type *)(plVar2 + 2);
                                if ((size_type *)*plVar2 == psVar4) {
                                  local_88._16_8_ = *psVar4;
                                  local_88._24_8_ = plVar2[3];
                                }
                                else {
                                  local_88._16_8_ = *psVar4;
                                  local_88._0_8_ = (size_type *)*plVar2;
                                }
                                local_88._8_8_ = plVar2[1];
                                *plVar2 = (long)psVar4;
                                plVar2[1] = 0;
                                *(undefined1 *)(plVar2 + 2) = 0;
                                std::__cxx11::string::operator=((string *)error,(string *)local_88);
                                if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
                                  operator_delete((void *)local_88._0_8_);
                                }
                                if (local_c8 != &local_b8) {
                                  operator_delete(local_c8);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                                  operator_delete(local_50._M_dataplus._M_p);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare
                                        ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11))
                      ;
                      pGVar10 = local_a8;
                      if (iVar1 == 0) goto LAB_0025a6c4;
                      iVar1 = std::__cxx11::string::compare
                                        ((char *)((long)&(((options->
                                                                                                                      
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar11));
                      ppVar9 = (options->
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      if (iVar1 == 0) {
                        if (*(long *)((long)&(ppVar9->second)._M_string_length + lVar11) != 0) {
                          pcVar8 = "Unexpected option value for one_output_file_per_input_file";
LAB_0025a928:
                          std::__cxx11::string::operator=((string *)error,pcVar8);
                          return false;
                        }
                        this->one_output_file_per_input_file = true;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare
                                          ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11
                                                   ));
                        ppVar9 = (options->
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                        if (iVar1 != 0) {
                          iVar1 = std::__cxx11::string::compare
                                            ((char *)((long)&(ppVar9->second)._M_dataplus._M_p +
                                                     lVar11));
                          pGVar10 = this;
                          if (iVar1 != 0) {
                            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_88,"Unknown option: ",
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)((long)&(((options->
                                                                                                                
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar11));
                            std::__cxx11::string::operator=((string *)error,(string *)local_88);
                            if ((undefined1 *)local_88._0_8_ == local_88 + 0x10) {
                              return false;
                            }
                            operator_delete((void *)local_88._0_8_);
                            return false;
                          }
                          goto LAB_0025a6c4;
                        }
                        if (*(long *)((long)&(ppVar9->second)._M_string_length + lVar11) != 0) {
                          pcVar8 = "Unexpected option value for annotate_code";
                          goto LAB_0025a928;
                        }
                        this->annotate_code = true;
                      }
                    }
                    goto LAB_0025a6c9;
                  }
                }
              }
LAB_0025a6c4:
              std::__cxx11::string::_M_assign((string *)pGVar10);
            }
          }
        }
      }
LAB_0025a6c9:
      uVar7 = uVar7 + 1;
      ppVar9 = (options->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x40;
    } while (uVar7 < (ulong)((long)(options->
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9 >> 6))
    ;
  }
  bVar6 = true;
  if ((this->import_style != kImportClosure) &&
     ((((this->add_require_for_enums != false || (this->testonly != false)) ||
       ((this->library)._M_string_length != 0)) ||
      ((iVar1 = std::__cxx11::string::compare((char *)&this->extension), iVar1 != 0 ||
       (this->one_output_file_per_input_file == true)))))) {
    pcVar8 = (char *)error->_M_string_length;
    pcVar5 = 
    "The add_require_for_enums, testonly, library, extension, and one_output_file_per_input_file options should only be used for import_style=closure"
    ;
LAB_0025a8c2:
    bVar6 = false;
    std::__cxx11::string::_M_replace((ulong)error,0,pcVar8,(ulong)pcVar5);
  }
  return bVar6;
}

Assistant:

bool GeneratorOptions::ParseFromOptions(
    const std::vector<std::pair<std::string, std::string> >& options,
    std::string* error) {
  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "add_require_for_enums") {
      if (options[i].second != "") {
        *error = "Unexpected option value for add_require_for_enums";
        return false;
      }
      add_require_for_enums = true;
    } else if (options[i].first == "binary") {
      if (options[i].second != "") {
        *error = "Unexpected option value for binary";
        return false;
      }
      binary = true;
    } else if (options[i].first == "testonly") {
      if (options[i].second != "") {
        *error = "Unexpected option value for testonly";
        return false;
      }
      testonly = true;

    } else if (options[i].first == "error_on_name_conflict") {
      GOOGLE_LOG(WARNING) << "Ignoring error_on_name_conflict option, this "
                             "will be removed in a future release";
    } else if (options[i].first == "output_dir") {
      output_dir = options[i].second;
    } else if (options[i].first == "namespace_prefix") {
      namespace_prefix = options[i].second;
    } else if (options[i].first == "library") {
      library = options[i].second;
    } else if (options[i].first == "import_style") {
      if (options[i].second == "closure") {
        import_style = kImportClosure;
      } else if (options[i].second == "commonjs") {
        import_style = kImportCommonJs;
      } else if (options[i].second == "commonjs_strict") {
        import_style = kImportCommonJsStrict;
      } else if (options[i].second == "browser") {
        import_style = kImportBrowser;
      } else if (options[i].second == "es6") {
        import_style = kImportEs6;
      } else {
        *error = "Unknown import style " + options[i].second + ", expected " +
                 "one of: closure, commonjs, browser, es6.";
      }
    } else if (options[i].first == "extension") {
      extension = options[i].second;
    } else if (options[i].first == "one_output_file_per_input_file") {
      if (!options[i].second.empty()) {
        *error = "Unexpected option value for one_output_file_per_input_file";
        return false;
      }
      one_output_file_per_input_file = true;
    } else if (options[i].first == "annotate_code") {
      if (!options[i].second.empty()) {
        *error = "Unexpected option value for annotate_code";
        return false;
      }
      annotate_code = true;
    } else {
      // Assume any other option is an output directory, as long as it is a bare
      // `key` rather than a `key=value` option.
      if (options[i].second != "") {
        *error = "Unknown option: " + options[i].first;
        return false;
      }
      output_dir = options[i].first;
    }
  }

  if (import_style != kImportClosure &&
      (add_require_for_enums || testonly || !library.empty() ||
       extension != ".js" || one_output_file_per_input_file)) {
    *error =
        "The add_require_for_enums, testonly, library, extension, and "
        "one_output_file_per_input_file options should only be "
        "used for import_style=closure";
    return false;
  }

  return true;
}